

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *pTVar4;
  TValue k;
  Value local_20;
  undefined4 local_18;
  
  pTVar4 = index2addr(L,idx);
  local_18 = 2;
  pTVar1 = L->top;
  local_20.p = p;
  pTVar4 = luaH_get((Table *)(pTVar4->value_).gc,(TValue *)&local_20);
  iVar2 = pTVar4->tt_;
  uVar3 = *(undefined4 *)&pTVar4->field_0xc;
  pTVar1->value_ = pTVar4->value_;
  pTVar1->tt_ = iVar2;
  *(undefined4 *)&pTVar1->field_0xc = uVar3;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  return pTVar1->tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  Table *t;
  TValue k;
  lua_lock(L);
  t = gettable(L, idx);
  setpvalue(&k, cast_voidp(p));
  return finishrawget(L, luaH_get(t, &k));
}